

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringView,_QChar_&>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QStringView,_QChar_&> *this)

{
  long lVar1;
  char16_t *__dest;
  qsizetype n;
  
  if (((this->a).m_data == (storage_type_conflict *)0x0) && (this->b->ucs == L'\0')) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = (this->a).m_size;
    (__return_storage_ptr__->d).size = -0x5555555555555556;
    (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + 1,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar1 = (this->a).m_size;
    if (lVar1 != 0) {
      memcpy(__dest,(this->a).m_data,lVar1 * 2);
    }
    __dest[lVar1] = this->b->ucs;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }